

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O3

void do_cmd_options_win(char *name,wchar_t row)

{
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  wchar_t c;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  wchar_t a;
  ulong uVar7;
  ulong uVar8;
  char *s;
  wchar_t y;
  int iVar9;
  wchar_t wVar10;
  uint uVar11;
  uint uVar12;
  char (*__s) [16];
  keypress ch;
  ui_event uVar14;
  uint32_t flag;
  uint32_t new_flags [8];
  uint32_t local_58 [8];
  long local_38;
  ulong uVar13;
  
  local_58._16_8_ = window_flag._16_8_;
  local_58._24_8_ = window_flag._24_8_;
  local_58._0_8_ = window_flag._0_8_;
  local_58._8_8_ = window_flag._8_8_;
  screen_save();
  clear_from(L'\0');
  uVar7 = 0;
  uVar2 = 0;
LAB_001fbf80:
  do {
    uVar4 = uVar2;
    uVar13 = uVar7;
    uVar11 = (uint)uVar13;
    uVar5 = 1 << ((byte)uVar4 & 0x1f);
    local_38 = (long)(int)uVar11;
    bVar1 = (byte)uVar4 & 0x1f;
    uVar6 = -2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1;
LAB_001fbfbe:
    do {
      while( true ) {
        prt("Window flags (<dir> to move, \'t\'/Enter to toggle, or ESC)",L'\0',L'\0');
        iVar9 = 0x23;
        __s = angband_term_name;
        uVar7 = 0;
        do {
          wVar10 = L'\x01';
          if (uVar13 == uVar7) {
            wVar10 = L'\x0e';
          }
          sVar3 = strlen(*__s);
          Term_putstr(iVar9 - (int)(sVar3 >> 1),(uint)uVar7 & 1 | 2,L'\xffffffff',wVar10,*__s);
          uVar7 = uVar7 + 1;
          iVar9 = iVar9 + 5;
          __s = __s + 1;
        } while (uVar7 != 8);
        uVar7 = 0;
        do {
          s = window_flag_desc[uVar7];
          wVar10 = L'\x01';
          if (uVar7 == uVar4) {
            wVar10 = L'\x0e';
          }
          if (s == (char *)0x0) {
            s = "(Unused option)";
          }
          y = (int)uVar7 + L'\x05';
          Term_putstr(L'\0',y,L'\xffffffff',wVar10,s);
          wVar10 = L'#';
          uVar8 = 0;
          do {
            a = L'\x01';
            if (uVar13 == uVar8 && uVar7 == uVar4) {
              a = L'\x0e';
            }
            c = L'.';
            if ((local_58[uVar8] & 1 << ((byte)uVar7 & 0x1f)) != 0) {
              c = L'X';
            }
            Term_putch(wVar10,y,a,c);
            uVar8 = uVar8 + 1;
            wVar10 = wVar10 + L'\x05';
          } while (uVar8 != 8);
          uVar7 = uVar7 + 1;
        } while (uVar7 != 0x10);
        Term_gotoxy(uVar11 * 5 + L'#',uVar4 + L'\x05');
        uVar14 = inkey_ex();
        uVar7 = uVar14._0_8_;
        uVar12 = uVar14.key.code;
        if (uVar14.type == EVT_KBRD) break;
        if (uVar14.type == EVT_MOUSE) {
          if ((uVar7 & 0xff000000000000) == 0x2000000000000) {
LAB_001fc269:
            subwindows_set_flags(local_58,8);
            screen_load();
            return;
          }
          if ((((byte)((char)uVar14.key.code * -0x33) < 0x34) &&
              (uVar2 = (uVar12 >> 8 & 0xff) - 5, uVar2 < 0x10)) && ((uVar12 & 0xff) - 0x28 < 0x23))
          {
            iVar9 = (uVar12 & 0xff) * 0x6667 + -0xe0015;
            uVar12 = (iVar9 >> 0x11) - (iVar9 >> 0x1f);
            uVar7 = (ulong)uVar12;
            if ((uVar2 != uVar4) || (uVar11 != uVar12)) goto LAB_001fbf80;
            uVar2 = local_58[uVar13];
            uVar12 = uVar2 & uVar6;
            if ((uVar2 & uVar5) == 0) {
              uVar12 = uVar2 | uVar5;
            }
            local_58[uVar13] = uVar12;
          }
        }
      }
      if ((int)uVar12 < 0x74) {
        if (uVar12 == 0x35) goto LAB_001fc113;
        if (uVar12 == 0x71) goto LAB_001fc269;
      }
      else {
        if ((uVar12 == 0x74) || (uVar12 == 0x9c)) {
LAB_001fc113:
          if (uVar13 == 0) {
            bell();
          }
          else {
            uVar2 = local_58[local_38];
            if ((uVar2 & uVar5) == 0) {
              local_58[local_38] = uVar2 | uVar5;
            }
            else {
              local_58[local_38] = uVar2 & uVar6;
            }
          }
          goto LAB_001fbfbe;
        }
        if (uVar12 == 0xe000) goto LAB_001fc269;
      }
      ch._8_4_ = uVar14._8_4_ & 0xff;
      ch.type = (int)uVar7;
      ch.code = (int)(uVar7 >> 0x20);
      wVar10 = target_dir(ch);
    } while (wVar10 == L'\0');
    uVar5 = uVar11 + (int)ddx[wVar10] + 8;
    uVar2 = (int)ddx[wVar10] + uVar11 + 0xf;
    if (-1 < (int)uVar5) {
      uVar2 = uVar5;
    }
    uVar6 = uVar4 + (int)ddy[wVar10] + 0x10;
    uVar4 = (int)ddy[wVar10] + uVar4 + 0x1f;
    if (-1 < (int)uVar6) {
      uVar4 = uVar6;
    }
    uVar7 = (ulong)(uVar5 - (uVar2 & 0xfffffff8));
    uVar2 = uVar6 - (uVar4 & 0xfffffff0);
  } while( true );
}

Assistant:

static void do_cmd_options_win(const char *name, int row)
{
	int i, j, d;
	int y = 0;
	int x = 0;
	ui_event ke;
	uint32_t new_flags[ANGBAND_TERM_MAX];

	/* Set new flags to the old values */
	for (j = 0; j < ANGBAND_TERM_MAX; j++)
		new_flags[j] = window_flag[j];

	/* Clear screen */
	screen_save();
	clear_from(0);

	/* Interact */
	while (1) {
		/* Prompt */
		prt("Window flags (<dir> to move, 't'/Enter to toggle, or ESC)", 0, 0);

		/* Display the windows */
		for (j = 0; j < ANGBAND_TERM_MAX; j++) {
			uint8_t a = COLOUR_WHITE;

			const char *s = angband_term_name[j];

			/* Use color */
			if (j == x) a = COLOUR_L_BLUE;

			/* Window name, staggered, centered */
			Term_putstr(35 + j * 5 - strlen(s) / 2, 2 + j % 2, -1, a, s);
		}

		/* Display the options */
		for (i = 0; i < PW_MAX_FLAGS; i++) {
			uint8_t a = COLOUR_WHITE;

			const char *str = window_flag_desc[i];

			/* Use color */
			if (i == y) a = COLOUR_L_BLUE;

			/* Unused option */
			if (!str) str = "(Unused option)";

			/* Flag name */
			Term_putstr(0, i + 5, -1, a, str);

			/* Display the windows */
			for (j = 0; j < ANGBAND_TERM_MAX; j++) {
				wchar_t c = L'.';

				a = COLOUR_WHITE;

				/* Use color */
				if ((i == y) && (j == x)) a = COLOUR_L_BLUE;

				/* Active flag */
				if (new_flags[j] & ((uint32_t) 1 << i)) c = L'X';

				/* Flag value */
				Term_putch(35 + j * 5, i + 5, a, c);
			}
		}

		/* Place Cursor */
		Term_gotoxy(35 + x * 5, y + 5);

		/* Get key */
		ke = inkey_ex();

		/* Mouse or keyboard interaction */
		if (ke.type == EVT_MOUSE) {
			int choicey = ke.mouse.y - 5;
			int choicex = (ke.mouse.x - 35)/5;

			if (ke.mouse.button == 2)
				break;

			if ((choicey >= 0) && (choicey < PW_MAX_FLAGS)
				&& (choicex > 0) && (choicex < ANGBAND_TERM_MAX)
				&& !(ke.mouse.x % 5)) {
				if ((choicey == y) && (choicex == x)) {
					uint32_t flag = ((uint32_t) 1) << y;

					/* Toggle flag (off) */
					if (new_flags[x] & flag)
						new_flags[x] &= ~flag;
					/* Toggle flag (on) */
					else
						new_flags[x] |= flag;
				} else {
					y = choicey;
					x = (ke.mouse.x - 35)/5;
				}
			}
		} else if (ke.type == EVT_KBRD) {
			if (ke.key.code == ESCAPE || ke.key.code == 'q')
				break;

			/* Toggle */
			else if (ke.key.code == '5' || ke.key.code == 't' ||
					ke.key.code == KC_ENTER) {
				/* Hack -- ignore the main window */
				if (x == 0)
					bell();

				/* Toggle flag (off) */
				else if (new_flags[x] & (((uint32_t) 1) << y))
					new_flags[x] &= ~(((uint32_t) 1) << y);

				/* Toggle flag (on) */
				else
					new_flags[x] |= (((uint32_t) 1) << y);

				/* Continue */
				continue;
			}

			/* Extract direction */
			d = target_dir(ke.key);

			/* Move */
			if (d != 0) {
				x = (x + ddx[d] + 8) % ANGBAND_TERM_MAX;
				y = (y + ddy[d] + 16) % PW_MAX_FLAGS;
			}
		}
	}

	/* Notice changes */
	subwindows_set_flags(new_flags, ANGBAND_TERM_MAX);

	screen_load();
}